

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::setAmPmStrings
          (DateFormatSymbols *this,UnicodeString *amPmsArray,int32_t count)

{
  UnicodeString *this_00;
  UnicodeString *pUVar1;
  UnicodeString *p;
  int32_t count_local;
  UnicodeString *amPmsArray_local;
  DateFormatSymbols *this_local;
  
  if ((this->fAmPms != (UnicodeString *)0x0) &&
     (pUVar1 = this->fAmPms, pUVar1 != (UnicodeString *)0x0)) {
    this_00 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    p = amPmsArray;
    while (pUVar1 != this_00) {
      this_00 = this_00 + -1;
      icu_63::UnicodeString::~UnicodeString(this_00);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),p);
  }
  pUVar1 = newUnicodeStringArray((long)count);
  this->fAmPms = pUVar1;
  uprv_arrayCopy(amPmsArray,this->fAmPms,count);
  this->fAmPmsCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setAmPmStrings(const UnicodeString* amPmsArray, int32_t count)
{
    // delete the old list if we own it
    if (fAmPms) delete[] fAmPms;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fAmPms = newUnicodeStringArray(count);
    uprv_arrayCopy(amPmsArray,fAmPms,count);
    fAmPmsCount = count;
}